

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMoveToCcr<(moira::Instr)75,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int src;
  u32 in_stack_ffffffffffffffdc;
  u8 val;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)2,0ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)in_RDI);
  val = (u8)in_stack_ffffffffffffffe8;
  if (bVar1) {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,4);
    setCCR(in_RDI,val);
    readM<(moira::MemSpace)2,(moira::Size)2,0ul>(in_RDI,in_stack_ffffffffffffffdc);
    prefetch<4ul>(in_RDI);
  }
  return;
}

Assistant:

void
Moira::execMoveToCcr(u16 opcode)
{
    int src = _____________xxx(opcode);
    u32 ea, data;
    
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    sync(4);
    setCCR(data);

    (void)readM <MEM_PROG, Word> (reg.pc + 2);
    prefetch<POLLIPL>();
}